

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Retime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_3c;
  uint local_38;
  int fVerbose;
  int nMaxIters;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_38 = 100;
  local_3c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Nvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Retime(): There is no AIG.\n");
          return 1;
        }
        iVar1 = Gia_ManRegNum(pAbc->pGia);
        if (iVar1 == 0) {
          Abc_Print(-1,"The network is combinational.\n");
          return 0;
        }
        pNew = Gia_ManRetimeForward(pAbc->pGia,local_38,local_3c);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      if (iVar1 == 0x4e) break;
      if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_002a5ce8;
      local_3c = local_3c ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    local_38 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_38 < 0) {
LAB_002a5ce8:
      Abc_Print(-2,"usage: &retime [-N <num>] [-vh]\n");
      Abc_Print(-2,"\t         performs most-forward retiming\n");
      Abc_Print(-2,"\t-N num : the number of incremental iterations [default = %d]\n",
                (ulong)local_38);
      pcVar2 = "no";
      if (local_3c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_002a5ce8;
}

Assistant:

int Abc_CommandAbc9Retime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int nMaxIters = 100;
    int fVerbose  =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nMaxIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxIters < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Retime(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    pTemp = Gia_ManRetimeForward( pAbc->pGia, nMaxIters, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &retime [-N <num>] [-vh]\n" );
    Abc_Print( -2, "\t         performs most-forward retiming\n" );
    Abc_Print( -2, "\t-N num : the number of incremental iterations [default = %d]\n", nMaxIters );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}